

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::GLMClassifier::MergePartialFromCodedStream
          (GLMClassifier *this,CodedInputStream *input)

{
  CodedInputStream *input_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  GLMClassifier_DoubleArray *value_00;
  RepeatedField<double> *pRVar5;
  StringVector *value_01;
  Int64Vector *value_02;
  bool local_92;
  bool local_91;
  GLMClassifier_ClassEncoding local_7c;
  GLMClassifier_PostEvaluationTransform local_78;
  int value_1;
  int value;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  GLMClassifier *this_local;
  bool local_3d;
  uint32 local_3c;
  bool local_35;
  uint32 tag_1;
  undefined4 uStack_30;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  unique0x10000417 = input;
LAB_00227f3b:
  _first_byte_or_zero = stack0xffffffffffffff98;
  kMax1ByteVarint = 0x3fff;
  tag_2 = 0;
  if (stack0xffffffffffffff98->buffer_ < stack0xffffffffffffff98->buffer_end_) {
    tag_2 = (uint32)*stack0xffffffffffffff98->buffer_;
    if ((char)*stack0xffffffffffffff98->buffer_ < '\x01') {
      if ((stack0xffffffffffffff98->buffer_end_ <= stack0xffffffffffffff98->buffer_ + 1) ||
         ((*stack0xffffffffffffff98->buffer_ & (stack0xffffffffffffff98->buffer_[1] ^ 0xff)) < 0x80)
         ) goto LAB_002280cc;
      uStack_30 = 0x3fff;
      tag_1 = (uint)stack0xffffffffffffff98->buffer_[1] * 0x80 +
              (*stack0xffffffffffffff98->buffer_ - 0x80);
      google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,2);
      local_92 = 0x3ffe < kMax1ByteVarint || tag_1 <= kMax1ByteVarint;
      local_35 = local_92;
      pVar4 = std::make_pair<unsigned_int&,bool&>(&tag_1,&local_35);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*stack0xffffffffffffff98->buffer_;
      google::protobuf::io::CodedInputStream::Advance(stack0xffffffffffffff98,1);
      local_91 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_91;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
  }
  else {
LAB_002280cc:
    local_3c = google::protobuf::io::CodedInputStream::ReadTagFallback
                         (stack0xffffffffffffff98,tag_2);
    local_3d = local_3c - 1 < kMax1ByteVarint;
    pVar4 = std::make_pair<unsigned_int_const&,bool>(&local_3c,&local_3d);
    local_10 = pVar4.first;
    uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
  }
  value._0_1_ = (undefined1)uStack_c;
  value_1 = local_10;
  p.first = value_1;
  if ((uStack_c & 1) != 0) {
    iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
    input_00 = stack0xffffffffffffff98;
    if (iVar2 == 1) {
      if ((p.first & 0xff) != 10) goto LAB_00228374;
      value_00 = add_weights(this);
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadMessageNoVirtual<CoreML::Specification::GLMClassifier_DoubleArray>
                        (input_00,value_00);
      goto joined_r0x00228368;
    }
    if (iVar2 == 2) {
      if ((p.first & 0xff) == 0x12) {
        pRVar5 = mutable_offset(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input_00,pRVar5);
      }
      else {
        if ((p.first & 0xff) != 0x11) goto LAB_00228374;
        pRVar5 = mutable_offset(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitiveNoInline<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (1,0x12,input_00,pRVar5);
      }
      goto joined_r0x00228368;
    }
    if (iVar2 != 3) {
      if (iVar2 != 4) {
        if (iVar2 == 100) {
          if ((p.first & 0xff) != 0x22) goto LAB_00228374;
          value_01 = mutable_stringclasslabels(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::StringVector>(input_00,value_01);
        }
        else {
          if ((iVar2 != 0x65) || ((p.first & 0xff) != 0x2a)) goto LAB_00228374;
          value_02 = mutable_int64classlabels(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadMessageNoVirtual<CoreML::Specification::Int64Vector>(input_00,value_02);
        }
        goto joined_r0x00228368;
      }
      if ((p.first & 0xff) != 0x20) goto LAB_00228374;
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (stack0xffffffffffffff98,&local_7c);
      if (!bVar1) {
        return false;
      }
      set_classencoding(this,local_7c);
      goto LAB_00227f3b;
    }
    if ((p.first & 0xff) == 0x18) {
      bVar1 = google::protobuf::internal::WireFormatLite::
              ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                        (stack0xffffffffffffff98,&local_78);
      if (!bVar1) {
        return false;
      }
      set_postevaluationtransform(this,local_78);
      goto LAB_00227f3b;
    }
  }
LAB_00228374:
  if ((p.first == 0) ||
     (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(p.first),
     WVar3 == WIRETYPE_END_GROUP)) {
    return true;
  }
  bVar1 = google::protobuf::internal::WireFormatLite::SkipField(stack0xffffffffffffff98,p.first);
joined_r0x00228368:
  if (!bVar1) {
    return false;
  }
  goto LAB_00227f3b;
}

Assistant:

bool GLMClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.GLMClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double offset = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_offset())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(17u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 18u, input, this->mutable_offset())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_postevaluationtransform(static_cast< ::CoreML::Specification::GLMClassifier_PostEvaluationTransform >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_classencoding(static_cast< ::CoreML::Specification::GLMClassifier_ClassEncoding >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.GLMClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.GLMClassifier)
  return false;
#undef DO_
}